

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_size_Test::~test_matrix_sparse_size_Test(test_matrix_sparse_size_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, size) {
  Matrix_Sparse matrix;
  EXPECT_EQ(matrix.size_row(), 0);
  EXPECT_EQ(matrix.size_column(), 0);
  EXPECT_EQ(matrix.size_non_zero(), 0);
  EXPECT_EQ(matrix.size().first, std::make_pair(0, 0).first);
  EXPECT_EQ(matrix.size().second, std::make_pair(0, 0).second);

  matrix.resize(7, 6);
  matrix[0][5] = 1.0;  // add additional entry - show that non-zero increased.
  EXPECT_FALSE(matrix.empty());
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_column(), 6);
  EXPECT_EQ(matrix.size_non_zero(), 1);
  EXPECT_EQ(matrix.size().first, std::make_pair(7, 6).first);
  EXPECT_EQ(matrix.size().second, std::make_pair(7, 6).second);
}